

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

_Bool monster_change_shape(monster *mon)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  monster_spell *pmVar4;
  int iVar5;
  source origin;
  source sVar6;
  char local_a8 [8];
  char m_name [80];
  monster_spell *spell;
  wchar_t local_40;
  wchar_t summon_type;
  wchar_t index;
  wchar_t which;
  wchar_t poss;
  wchar_t i;
  bitflag summon_spells [12];
  wchar_t choice;
  monster_race *race;
  monster_shape *shape;
  monster *mon_local;
  
  race = (monster_race *)mon->race->shapes;
  stack0xffffffffffffffe0 = (monster_race *)0x0;
  if (race == (monster_race *)0x0) {
    index = L'\0';
    create_mon_spell_mask((bitflag *)&poss,0x400,0);
    flag_inter((bitflag *)&poss,mon->race->spell_flags,0xc);
    for (which = flag_next((bitflag *)&poss,0xc,1); which != L'\0';
        which = flag_next((bitflag *)&poss,0xc,which + L'\x01')) {
      index = index + L'\x01';
    }
    wVar2 = Rand_div(index);
    local_40 = flag_next((bitflag *)&poss,0xc,1);
    for (which = L'\0'; which < wVar2; which = which + L'\x01') {
      local_40 = flag_next((bitflag *)&poss,0xc,local_40);
    }
    pmVar4 = monster_spell_by_index(local_40);
    wVar2 = pmVar4->effect->subtype;
    wVar3 = summon_name_to_idx("KIN");
    if (wVar2 == wVar3) {
      kin_base = mon->race->base;
    }
    register0x00000000 = select_shape(mon,wVar2);
  }
  else {
    summon_spells._4_4_ = Rand_div(mon->race->num_shapes);
    while (iVar5 = summon_spells._4_4_ + -1, summon_spells._4_4_ != 0) {
      race = race->next;
      summon_spells._4_4_ = iVar5;
    }
    if (race->name == (char *)0x0) {
      shape_base = (monster_base *)race->text;
      summon_spells._4_4_ = iVar5;
      get_mon_num_prep(monster_base_shape_okay);
      register0x00000000 = get_mon_num(player->depth + L'\x05',(int)player->depth);
      get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
    }
    else {
      unique0x00012000 = (monster_race *)race->name;
      summon_spells._4_4_ = iVar5;
    }
  }
  _Var1 = monster_is_obvious(mon);
  if (_Var1) {
    monster_desc(local_a8,0x50,mon,L'̔');
    msgt(0,"%s %s",local_a8,"shimmers and changes!");
    if (player->upkeep->health_who == mon) {
      player->upkeep->redraw = player->upkeep->redraw | 0x200;
    }
    player->upkeep->redraw = player->upkeep->redraw | 0x400000;
    square_light_spot((chunk *)cave,(loc)mon->grid);
  }
  if (stack0xffffffffffffffe0 != (monster_race *)0x0) {
    if (mon->original_race == (monster_race *)0x0) {
      mon->original_race = mon->race;
    }
    mon->race = stack0xffffffffffffffe0;
    mon->mspeed = mon->mspeed + ((char)mon->race->speed - (char)mon->original_race->speed);
  }
  _Var1 = monster_passes_walls(mon);
  if ((!_Var1) && (_Var1 = square_is_monster_walkable((chunk *)cave,mon->grid), !_Var1)) {
    sVar6 = source_monster(mon->midx);
    origin.which = sVar6.which;
    origin._4_4_ = 0;
    origin.what = sVar6.what;
    effect_simple(L':',origin,"1",L'\0',L'\0',L'\0',(mon->grid).y,(mon->grid).x,(_Bool *)0x0);
  }
  return mon->original_race != (monster_race *)0x0;
}

Assistant:

bool monster_change_shape(struct monster *mon)
{
	struct monster_shape *shape = mon->race->shapes;
	struct monster_race *race = NULL;

	/* Use the monster's preferred shapes if any */
	if (shape) {
		/* Pick one */
		int choice = randint0(mon->race->num_shapes);
		while (choice--) {
			shape = shape->next;
		}

		/* Race or base? */
		if (shape->race) {
			/* Simple */
			race = shape->race;
		} else {
			/* Set the shape base */
			shape_base = shape->base;

			/* Choose a race of the given base */
			get_mon_num_prep(monster_base_shape_okay);

			/* Pick a random race */
			race = get_mon_num(player->depth + 5, player->depth);

			/* Reset allocation table */
			get_mon_num_prep(NULL);
		}
	} else {
		/* Choose something the monster can summon */
		bitflag summon_spells[RSF_SIZE];
		int i, poss = 0, which, index, summon_type;
		const struct monster_spell *spell;

		/* Extract the summon spells */
		create_mon_spell_mask(summon_spells, RST_SUMMON, RST_NONE);
		rsf_inter(summon_spells, mon->race->spell_flags);

		/* Count possibilities */
		for (i = rsf_next(summon_spells, FLAG_START); i != FLAG_END;
			 i = rsf_next(summon_spells, i + 1)) {
			poss++;
		}

		/* Pick one */
		which = randint0(poss);
		index = rsf_next(summon_spells, FLAG_START);
		for (i = 0; i < which; i++) {
			index = rsf_next(summon_spells, index);
		}
		spell = monster_spell_by_index(index);

		/* Set the summon type, and the kin_base if necessary */
		summon_type = spell->effect->subtype;
		if (summon_type == summon_name_to_idx("KIN")) {
			kin_base = mon->race->base;
		}

		/* Choose a race */
		race = select_shape(mon, summon_type);
	}

	/* Print a message immediately, update visuals */
	if (monster_is_obvious(mon)) {
		char m_name[80];
		monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);
		msgt(MSG_GENERIC, "%s %s", m_name, "shimmers and changes!");
		if (player->upkeep->health_who == mon)
			player->upkeep->redraw |= (PR_HEALTH);

		player->upkeep->redraw |= (PR_MONLIST);
		square_light_spot(cave, mon->grid);
	}

	/* Set the race */
	if (race) {
		if (!mon->original_race) mon->original_race = mon->race;
		mon->race = race;
		mon->mspeed += mon->race->speed - mon->original_race->speed;
	}

	/* Emergency teleport if needed */
	if (!monster_passes_walls(mon) &&
		!square_is_monster_walkable(cave, mon->grid)) {
		effect_simple(EF_TELEPORT, source_monster(mon->midx), "1", 0, 0, 0,
					  mon->grid.y, mon->grid.x, NULL);
	}

	return mon->original_race != NULL;
}